

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O3

void secp256k1_scalar_inverse(secp256k1_scalar *r,secp256k1_scalar *x)

{
  secp256k1_scalar sVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)*x);
  sVar1 = *x;
  iVar2 = sVar1 + 1;
  uVar3 = -sVar1;
  uVar5 = 0;
  do {
    iVar2 = iVar2 - sVar1;
    uVar3 = uVar3 + sVar1;
    if (uVar3 / 0xd + (uVar3 / 0xd) * 0xc + iVar2 == 0) goto LAB_00116518;
    uVar4 = (int)uVar5 - 1;
    uVar5 = (ulong)uVar4;
  } while (uVar4 != 0xfffffff3);
  do {
    secp256k1_scalar_inverse_cold_1();
LAB_00116518:
  } while ((int)uVar5 == 0);
  uVar3 = -(int)uVar5;
  *r = uVar3;
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uVar3);
  return;
}

Assistant:

static void secp256k1_scalar_inverse(secp256k1_scalar *r, const secp256k1_scalar *x) {
    int i;
    uint32_t res = 0;
    SECP256K1_SCALAR_VERIFY(x);

    for (i = 0; i < EXHAUSTIVE_TEST_ORDER; i++) {
        if ((i * *x) % EXHAUSTIVE_TEST_ORDER == 1) {
            res = i;
            break;
        }
    }

    /* If this VERIFY_CHECK triggers we were given a noninvertible scalar (and thus
     * have a composite group order; fix it in exhaustive_tests.c). */
    VERIFY_CHECK(res != 0);
    *r = res;

    SECP256K1_SCALAR_VERIFY(r);
}